

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_float.c
# Opt level: O0

vf_base_t vf_deflate_with_underflow
                    (vf_base_t input,vf_profile_t profile_in,vf_profile_t profile_out,
                    vf_status_t *status)

{
  char cVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  vf_base_t output;
  vf_base_t round_bit;
  vf_base_t output_1;
  vf_base_t threshold;
  vf_base_t underflow_threshold;
  vf_base_t rounding_mask;
  vf_base_t bits_delta;
  vf_base_t mnt_shift;
  vf_base_t bias_delta;
  vf_base_t mnt_out;
  vf_base_t sgn_out;
  vf_base_t mnt_in;
  vf_base_t exp_in;
  vf_status_t *status_local;
  vf_base_t input_local;
  
  cVar3 = (char)profile_out.mnt_bits;
  bVar2 = (byte)profile_in.mnt_bits;
  uVar6 = (input & profile_in.sgn_mask) >> ((char)profile_in.bits - (char)profile_out.bits & 0x3fU);
  uVar5 = input & profile_in.exp_mask;
  if ((ulong)((1L << ((char)profile_in.exp_bits - (char)profile_out.exp_bits & 0x3fU)) + -1 <<
             ((bVar2 + (char)profile_out.exp_bits) - 1 & 0x3f)) < uVar5) {
    __assert_fail("exp_in <= underflow_threshold",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                  ,0x7a,
                  "vf_base_t vf_deflate_with_underflow(vf_base_t, vf_profile_t, vf_profile_t, vf_status_t *)"
                 );
  }
  vf_set_status(status,0);
  if (uVar5 < (profile_in.bias - profile_out.bias) - (ulong)profile_out.mnt_bits << (bVar2 & 0x3f))
  {
    if ((input & input & (profile_in.sgn_mask ^ 0xffffffffffffffff)) != 0) {
      vf_set_status(status,-4);
    }
  }
  else {
    uVar4 = (1L << (bVar2 & 0x3f)) + (input & profile_in.mnt_mask);
    cVar1 = (char)(uVar5 >> (bVar2 & 0x3f));
    if ((uVar4 & (1L << ((((char)profile_in.bias - (char)profile_out.bias) + (bVar2 - cVar3) +
                         '\x01') - cVar1 & 0x3f)) - 1U) != 0) {
      vf_set_status(status,-4);
    }
    sgn_out = uVar4 >> ((((char)profile_in.bias - (char)profile_out.bias) + '\x01') - cVar1 & 0x3fU)
    ;
    uVar5 = profile_in.sgn_mask >> ((char)profile_in.exp_bits + '\x01' + cVar3 & 0x3fU);
    if ((sgn_out & (1L << ((bVar2 - cVar3) + 1 & 0x3f)) - 1U) != uVar5) {
      sgn_out = uVar5 + sgn_out;
    }
    uVar6 = uVar6 + (sgn_out >> (bVar2 - cVar3 & 0x3f));
  }
  input_local = uVar6 & profile_out.mask;
  return input_local;
}

Assistant:

vf_base_t vf_deflate_with_underflow(vf_base_t input, vf_profile_t profile_in, vf_profile_t profile_out, vf_status_t *status) {
	vf_base_t exp_in;
	vf_base_t mnt_in;
	
	vf_base_t sgn_out;
	vf_base_t mnt_out;
	
	const vf_base_t bias_delta = profile_in.bias - profile_out.bias;
	const vf_base_t mnt_shift = profile_in.mnt_bits - profile_out.mnt_bits;
	const vf_base_t bits_delta = profile_in.bits - profile_out.bits;
	
	const vf_base_t rounding_mask = ((vf_base_t)1 << (profile_in.mnt_bits - profile_out.mnt_bits + 1)) - 1;
	
	sgn_out = (input & profile_in.sgn_mask) >> bits_delta;
	exp_in = input & profile_in.exp_mask;
	
	const vf_base_t underflow_threshold = (((vf_base_t)0x1 << (profile_in.exp_bits - profile_out.exp_bits)) - 1) << (profile_in.mnt_bits + profile_out.exp_bits - 1);
	assert(exp_in <= underflow_threshold);
	
	vf_set_status(status, VF_STATUS_OK);
	
	/*
	 * Signed zeros, subnormal floats, and floats with small
	 * exponents all convert to sgned zero halfs.
	 */
	vf_base_t threshold = ((profile_in.bias - profile_out.bias- profile_out.mnt_bits) << profile_in.mnt_bits);
	if (exp_in < threshold) {
		if ((input & (input & ~(profile_in.sgn_mask))) != 0) {
			vf_set_status(status, VF_STATUS_UNDERFLOW);
		}
		const vf_base_t output = (sgn_out) & profile_out.mask;
		return output;
	}
	// Make the subnormal sgnificand
	exp_in >>= profile_in.mnt_bits;
	mnt_in = ((vf_base_t)1 << (profile_in.mnt_bits)) + (input & profile_in.mnt_mask);
	// If it's not exactly represented, it underflowed
	if ((mnt_in & ((vf_base_t)1 << ((profile_in.bias - profile_out.bias) + (profile_in.mnt_bits - profile_out.mnt_bits) + 1 - exp_in)) - 1) != 0) {
		vf_set_status(status, VF_STATUS_UNDERFLOW);
	}
	mnt_in >>= (bias_delta + 1) - exp_in;
	// Handle rounding by adding 1 to the bit beyond half precision
#if VF_ROUND_TIES_TO_EVEN
	/*
	 * If the last bit in the half sgnificand is 0 (already even), and
	 * the remaining bit pattern is 1000...0, then we do not add one
	 * to the bit after the half sgnificand.  In all other cases, we do.
	 */
	const vf_base_t round_bit = profile_in.sgn_mask >> (1 + profile_in.exp_bits + profile_out.mnt_bits);
	if ((mnt_in & rounding_mask) != round_bit) {
		mnt_in += round_bit;
	}
#else
	mnt_in += round_bit;
#endif
	mnt_out = mnt_in >> mnt_shift;
	/*
	 * If the rounding causes a bit to spill into exp_out, it will
	 * increment exp_out from zero to one and mnt_out will be zero.
	 * This is the correct result.
	 */
	const vf_base_t output = (sgn_out + mnt_out) & profile_out.mask;
	return output;
}